

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.hpp
# Opt level: O2

ostream * plot::detail::operator<<(ostream *stream,foreground_setter *setter)

{
  TerminalMode TVar1;
  Color c;
  undefined4 in_stack_ffffffffffffffe8;
  foreground_setter_24bit in_stack_ffffffffffffffec;
  foreground_setter in_stack_fffffffffffffff0;
  
  TVar1 = setter->mode;
  if (TVar1 == Iso24bit) {
    c.g = (float)in_stack_ffffffffffffffec.color;
    c.r = (float)in_stack_ffffffffffffffe8;
    c._8_8_ = in_stack_fffffffffffffff0.color;
    ansi::foreground24bit(c);
    stream = ansi::detail::operator<<(stream,(foreground_setter_24bit *)&stack0xffffffffffffffec);
  }
  else if (TVar1 == Ansi256) {
    ansi::detail::find_color256(setter->color);
    stream = ansi::detail::operator<<(stream,(foreground_setter_256 *)&stack0xffffffffffffffeb);
  }
  else if (TVar1 == Ansi) {
    ansi::foreground((ansi *)stream,setter->color);
    stream = ansi::detail::operator<<(stream,(foreground_setter *)&stack0xfffffffffffffff0);
  }
  return stream;
}

Assistant:

inline std::ostream& operator<<(std::ostream& stream, foreground_setter const& setter) {
        switch (setter.mode) {
            case TerminalMode::Ansi:
                return stream << ansi::foreground(setter.color);
            case TerminalMode::Ansi256:
                return stream << ansi::foreground256(setter.color);
            case TerminalMode::Iso24bit:
                return stream << ansi::foreground24bit(setter.color);
            default:
                return stream;
        }
    }